

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffComma(NodeDiffComputer *this,CommaExpr *lhs,CommaExpr *rhs)

{
  size_type_conflict sVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  ulong uVar6;
  
  sVar1 = (lhs->_exprs)._size;
  iVar2 = sVar1 - (rhs->_exprs)._size;
  if (iVar2 == 0) {
    if (sVar1 == 0) {
      iVar4 = 0;
    }
    else {
      uVar6 = 0;
      iVar4 = 0;
      do {
        iVar3 = diffNodes(this,&(lhs->_exprs)._vals[uVar6]->super_Node,
                          &(rhs->_exprs)._vals[uVar6]->super_Node);
        if (this->limit < iVar3) {
          return iVar3;
        }
        iVar4 = iVar4 + iVar3;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (lhs->_exprs)._size);
    }
  }
  else {
    iVar5 = -iVar2;
    if (0 < iVar2) {
      iVar5 = iVar2;
    }
    iVar4 = iVar5 * (this->DiffCosts).SizeDiffCoeff + (this->DiffCosts).SizeDiffCost;
  }
  return iVar4;
}

Assistant:

int32_t diffComma(const CommaExpr *lhs, const CommaExpr *rhs) {
    const auto &leftExpressions = lhs->expressions();
    const auto &rightExpression = rhs->expressions();

    if (leftExpressions.size() != rightExpression.size())
      return sizeDiff(leftExpressions.size(), rightExpression.size());

    int32_t result = 0;

    for (int32_t i = 0; i < leftExpressions.size(); ++i) {
      const Expr *l = leftExpressions[i];
      const Expr *r = rightExpression[i];

      int32_t tmp = diffNodes(l, r);

      if (tmp > limit)
        return tmp;

      result += tmp;
    }

    return result;
  }